

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_7zip.c
# Opt level: O1

int read_Header(archive_read *a,_7z_header_info *h,int check_header_id)

{
  _7z_coders_info *val;
  byte bVar1;
  uchar uVar2;
  _7z_stream_info *si;
  size_t sVar3;
  _7z_folder *p_Var4;
  _7z_coder *p_Var5;
  uint uVar6;
  int iVar7;
  uchar *p;
  uchar *puVar8;
  byte *pbVar9;
  _7z_folder *p_Var10;
  uint64_t *puVar11;
  ulong uVar12;
  uint uVar13;
  ulong uVar14;
  size_t rbytes;
  _7z_coder *p_Var15;
  int iVar16;
  ulong uVar17;
  uint uVar18;
  ulong uVar19;
  bool bVar20;
  uint64_t size;
  void *local_58;
  ulong local_48;
  uchar *local_40;
  ulong local_38;
  
  si = (_7z_stream_info *)a->format->data;
  if (check_header_id != 0) {
    puVar8 = header_bytes(a,1);
    if (puVar8 == (uchar *)0x0) {
      return -1;
    }
    if (*puVar8 != '\x01') {
      return -1;
    }
  }
  pbVar9 = header_bytes(a,1);
  if (pbVar9 == (byte *)0x0) {
    return -1;
  }
  if (*pbVar9 == 2) {
    do {
      puVar8 = header_bytes(a,1);
      if (puVar8 == (uchar *)0x0) {
        uVar6 = 1;
      }
      else if (*puVar8 == '\0') {
        uVar6 = 2;
      }
      else {
        uVar6 = parse_7zip_uint64(a,&local_48);
        uVar6 = uVar6 >> 0x1f;
      }
    } while (uVar6 == 0);
    if (uVar6 != 2) {
      return -1;
    }
    pbVar9 = header_bytes(a,1);
    if (pbVar9 == (byte *)0x0) {
      return -1;
    }
  }
  if (*pbVar9 == 4) {
    iVar7 = read_StreamsInfo(a,si);
    if (iVar7 < 0) {
      return -1;
    }
    pbVar9 = header_bytes(a,1);
    if (pbVar9 == (byte *)0x0) {
      return -1;
    }
  }
  bVar1 = *pbVar9;
  if (bVar1 == 0) {
    return (uint)bVar1;
  }
  if (bVar1 != 5) {
    return -1;
  }
  val = &si[1].ci;
  iVar7 = parse_7zip_uint64(a,&val->numFolders);
  if (iVar7 < 0) {
    return -1;
  }
  if (100000000 < val->numFolders) {
    return -1;
  }
  p_Var10 = (_7z_folder *)calloc(val->numFolders,0x50);
  si[1].ci.folders = p_Var10;
  if (p_Var10 == (_7z_folder *)0x0) {
    return -1;
  }
  uVar6 = 0;
LAB_0012cc60:
  pbVar9 = header_bytes(a,1);
  if (pbVar9 == (byte *)0x0) goto LAB_0012cc97;
  bVar1 = *pbVar9;
  if (bVar1 == 0) {
    iVar7 = 4;
    goto LAB_0012ce64;
  }
  iVar7 = parse_7zip_uint64(a,&local_48);
  uVar14 = local_48;
  if ((iVar7 < 0) || (si[1].pi.numPackStreams < local_48)) goto LAB_0012cc97;
  switch(bVar1) {
  case 0xe:
    if (h->emptyStreamBools == (uchar *)0x0) {
      sVar3 = val->numFolders;
      puVar8 = (uchar *)calloc(sVar3,1);
      h->emptyStreamBools = puVar8;
      if (puVar8 != (uchar *)0x0) {
        iVar16 = read_Bools(a,puVar8,sVar3);
        iVar7 = 1;
        if (iVar16 < 0) goto LAB_0012ce64;
        if (val->numFolders == 0) {
          uVar6 = 0;
        }
        else {
          uVar14 = 0;
          uVar6 = 0;
          do {
            uVar6 = (uVar6 + 1) - (uint)(h->emptyStreamBools[uVar14] == '\0');
            uVar14 = uVar14 + 1;
          } while ((uVar14 & 0xffffffff) < val->numFolders);
        }
        goto LAB_0012ce61;
      }
    }
    break;
  case 0xf:
    if ((int)uVar6 < 1) goto switchD_0012ccc9_caseD_16;
    if (h->emptyFileBools == (uchar *)0x0) {
      puVar8 = (uchar *)calloc((ulong)uVar6,1);
      h->emptyFileBools = puVar8;
LAB_0012cdc4:
      if (puVar8 != (uchar *)0x0) {
        iVar16 = read_Bools(a,puVar8,(ulong)uVar6);
        goto LAB_0012ccd9;
      }
    }
    break;
  case 0x10:
    if ((int)uVar6 < 1) goto switchD_0012ccc9_caseD_16;
    if (h->antiBools == (uchar *)0x0) {
      puVar8 = (uchar *)calloc((ulong)uVar6,1);
      h->antiBools = puVar8;
      goto LAB_0012cdc4;
    }
    break;
  case 0x11:
    puVar8 = header_bytes(a,1);
    iVar7 = 1;
    if ((((puVar8 == (uchar *)0x0) || (uVar14 = uVar14 - 1, (uVar14 & 1) != 0)) ||
        (uVar14 < val->numFolders << 2)) || (si[1].ss.unpack_streams != 0)) {
LAB_0012ce3e:
      bVar20 = false;
    }
    else {
      local_58 = malloc(uVar14);
      si[1].ss.unpack_streams = (size_t)local_58;
      uVar19 = uVar14;
      if (local_58 == (void *)0x0) goto LAB_0012ce3e;
      do {
        if (uVar19 == 0) {
          uVar19 = val->numFolders;
          if (uVar19 == 0) {
            bVar20 = true;
            goto LAB_0012d063;
          }
          p_Var15 = (_7z_coder *)si[1].ss.unpack_streams;
          uVar12 = 0;
          goto LAB_0012d004;
        }
        rbytes = 0x10000;
        if (uVar19 < 0x10000) {
          rbytes = uVar19;
        }
        puVar8 = header_bytes(a,rbytes);
        if (puVar8 != (uchar *)0x0) {
          local_40 = puVar8;
          local_38 = uVar19;
          memcpy(local_58,puVar8,rbytes);
          local_58 = (void *)((long)local_58 + rbytes);
          uVar19 = local_38 - rbytes;
          puVar8 = local_40;
        }
        bVar20 = false;
      } while (puVar8 != (uchar *)0x0);
    }
    goto LAB_0012ce40;
  case 0x12:
  case 0x13:
  case 0x14:
    iVar16 = read_Times(a,h,(uint)bVar1);
LAB_0012ccd9:
    iVar7 = 1;
    if (iVar16 < 0) goto LAB_0012ce64;
    goto LAB_0012ce61;
  case 0x15:
    puVar8 = header_bytes(a,2);
    iVar7 = 1;
    if ((puVar8 == (uchar *)0x0) || (h->attrBools != (uchar *)0x0)) {
LAB_0012cdff:
      bVar20 = false;
    }
    else {
      uVar2 = *puVar8;
      sVar3 = val->numFolders;
      puVar8 = (uchar *)calloc(sVar3,1);
      h->attrBools = puVar8;
      if (puVar8 == (uchar *)0x0) {
LAB_0012cfdd:
        iVar7 = 1;
        bVar20 = false;
      }
      else {
        if (uVar2 == '\0') {
          iVar16 = read_Bools(a,puVar8,sVar3);
          if (iVar16 < 0) goto LAB_0012cdff;
        }
        else {
          memset(puVar8,1,sVar3);
        }
        iVar7 = 6;
        bVar20 = true;
        if (val->numFolders != 0) {
          uVar14 = 1;
          uVar19 = 0;
          do {
            uVar12 = uVar14;
            if (h->attrBools[uVar19] != '\0') {
              puVar8 = header_bytes(a,4);
              if (puVar8 == (uchar *)0x0) goto LAB_0012cfdd;
              *(undefined4 *)(&p_Var10->digest_defined + uVar19 * 0x50) = *(undefined4 *)puVar8;
            }
            uVar14 = (ulong)((int)uVar12 + 1);
            uVar19 = uVar12;
          } while (uVar12 < val->numFolders);
          bVar20 = true;
        }
      }
    }
    if (bVar20) goto LAB_0012ce61;
    goto LAB_0012ce64;
  default:
    goto switchD_0012ccc9_caseD_16;
  case 0x19:
    if (local_48 == 0) goto LAB_0012ce61;
switchD_0012ccc9_caseD_16:
    puVar8 = header_bytes(a,local_48);
    iVar7 = 1;
    if (puVar8 != (uchar *)0x0) goto LAB_0012ce61;
    goto LAB_0012ce64;
  }
LAB_0012cc97:
  iVar7 = 1;
  goto LAB_0012ce64;
  while( true ) {
    (&p_Var10->numCoders)[uVar12 * 10] = (long)p_Var5 - (long)p_Var15;
    p_Var15 = (_7z_coder *)((long)&p_Var5->codec + 2);
    uVar14 = uVar14 - 2;
    uVar12 = (ulong)((int)uVar12 + 1);
    if (uVar19 <= uVar12) break;
LAB_0012d004:
    (&p_Var10->coders)[uVar12 * 10] = p_Var15;
    for (p_Var5 = p_Var15;
        (1 < uVar14 &&
        (((char)p_Var5->codec != '\0' || (*(undefined1 *)((long)&p_Var5->codec + 1) != '\0'))));
        p_Var5 = (_7z_coder *)((long)&p_Var5->codec + 2)) {
      uVar14 = uVar14 - 2;
    }
    bVar20 = uVar14 >= 2;
    if (uVar14 < 2) goto LAB_0012ce40;
  }
LAB_0012d063:
  iVar7 = 6;
LAB_0012ce40:
  if (bVar20) {
LAB_0012ce61:
    iVar7 = 0;
  }
LAB_0012ce64:
  if (iVar7 != 0) goto LAB_0012d073;
  goto LAB_0012cc60;
LAB_0012d073:
  if (iVar7 != 4) {
    return -1;
  }
  if (si[1].ci.numFolders == 0) {
    return 0;
  }
  p_Var4 = (si->ci).folders;
  iVar7 = 0;
  iVar16 = 0;
  uVar19 = 0;
  uVar6 = 0;
  uVar14 = 0;
  do {
    if ((h->emptyStreamBools == (uchar *)0x0) || (h->emptyStreamBools[uVar19] == '\0')) {
      *(byte *)(&p_Var10->bindPairs + uVar19 * 10) =
           *(byte *)(&p_Var10->bindPairs + uVar19 * 10) | 0x10;
    }
    uVar18 = *(uint *)(&p_Var10->digest_defined + uVar19 * 0x50);
    if ((short)uVar18 < 0) {
      uVar13 = uVar18 >> 0x10;
    }
    else {
      uVar13 = 0x416d;
      if ((uVar18 & 0x10) == 0) {
        uVar13 = 0x8124;
      }
      uVar13 = uVar13 | (uint)((uVar18 & 1) == 0) << 7;
    }
    puVar11 = &p_Var10->numCoders + uVar19 * 10;
    *(uint *)((long)puVar11 + 0x44) = uVar13;
    if ((*(uint *)(puVar11 + 3) & 0x10) == 0) {
      if (h->emptyFileBools == (uchar *)0x0) {
        bVar20 = false;
      }
      else {
        bVar20 = h->emptyFileBools[iVar16] != '\0';
        iVar16 = iVar16 + 1;
      }
      uVar18 = *(uint *)((long)puVar11 + 0x44);
      if (uVar18 == 0) {
        uVar18 = 0x41ff;
        if (bVar20) {
          uVar18 = 0x81b6;
        }
LAB_0012d1b8:
        *(uint *)((long)puVar11 + 0x44) = uVar18;
      }
      else if (!bVar20 && (uVar18 & 0xf000) != 0x4000) {
        uVar18 = uVar18 & 0xffff0fff | 0x4000;
        goto LAB_0012d1b8;
      }
      if ((((*(uint *)((long)puVar11 + 0x44) & 0xf000) == 0x4000) && (uVar12 = *puVar11, 1 < uVar12)
          ) && ((p_Var15 = (_7z_coder *)puVar11[1], *(char *)((long)p_Var15 + (uVar12 - 2)) != '/'
                || (*(char *)((long)p_Var15 + (uVar12 - 1)) != '\0')))) {
        *(undefined1 *)((long)&p_Var15->codec + uVar12) = 0x2f;
        *(undefined1 *)((long)&((_7z_coder *)puVar11[1])->codec + *puVar11 + 1) = 0;
        *puVar11 = *puVar11 + 2;
      }
      *(undefined4 *)((long)puVar11 + 0x14) = 0xffffffff;
    }
    else {
      if ((si->ss).unpack_streams <= (ulong)(long)iVar7) {
        return -1;
      }
      if (*(int *)((long)puVar11 + 0x44) == 0) {
        *(undefined4 *)((long)puVar11 + 0x44) = 0x81b6;
      }
      if ((si->ss).digestsDefined[iVar7] != '\0') {
        *(uint *)(puVar11 + 3) = *(uint *)(puVar11 + 3) | 8;
      }
      *(int *)((long)puVar11 + 0x14) = iVar7;
      iVar7 = iVar7 + 1;
    }
    if ((*(byte *)(puVar11 + 9) & 1) != 0) {
      *(byte *)((long)puVar11 + 0x44) = *(byte *)((long)puVar11 + 0x44) & 0x6d;
    }
    if (((ulong)puVar11[3] & 0x10) == 0 && uVar6 == 0) {
      *(undefined4 *)(puVar11 + 2) = 0xffffffff;
      uVar6 = 0;
    }
    else {
      if (uVar6 == 0) {
        while( true ) {
          if ((si->ci).numFolders <= uVar14) {
            return -1;
          }
          if (p_Var4[uVar14].numUnpackStreams != 0) break;
          uVar14 = (ulong)((int)uVar14 + 1);
        }
      }
      *(int *)(puVar11 + 2) = (int)uVar14;
      if (((ulong)puVar11[3] & 0x10) != 0) {
        uVar6 = uVar6 + 1;
        uVar17 = (ulong)uVar6;
        uVar12 = p_Var4[uVar14].numUnpackStreams;
        if (uVar12 <= uVar17) {
          uVar6 = 0;
        }
        uVar14 = (ulong)((uint)(uVar12 <= uVar17) + (int)uVar14);
      }
    }
    uVar19 = (ulong)((int)uVar19 + 1);
    if (val->numFolders <= uVar19) {
      return 0;
    }
  } while( true );
}

Assistant:

static int
read_Header(struct archive_read *a, struct _7z_header_info *h,
    int check_header_id)
{
	struct _7zip *zip = (struct _7zip *)a->format->data;
	const unsigned char *p;
	struct _7z_folder *folders;
	struct _7z_stream_info *si = &(zip->si);
	struct _7zip_entry *entries;
	uint32_t folderIndex, indexInFolder;
	unsigned i;
	int eindex, empty_streams, sindex;

	if (check_header_id) {
		/*
		 * Read Header.
		 */
		if ((p = header_bytes(a, 1)) == NULL)
			return (-1);
		if (*p != kHeader)
			return (-1);
	}

	/*
	 * Read ArchiveProperties.
	 */
	if ((p = header_bytes(a, 1)) == NULL)
		return (-1);
	if (*p == kArchiveProperties) {
		for (;;) {
			uint64_t size;
			if ((p = header_bytes(a, 1)) == NULL)
				return (-1);
			if (*p == 0)
				break;
			if (parse_7zip_uint64(a, &size) < 0)
				return (-1);
		}
		if ((p = header_bytes(a, 1)) == NULL)
			return (-1);
	}

	/*
	 * Read MainStreamsInfo.
	 */
	if (*p == kMainStreamsInfo) {
		if (read_StreamsInfo(a, &(zip->si)) < 0)
			return (-1);
		if ((p = header_bytes(a, 1)) == NULL)
			return (-1);
	}
	if (*p == kEnd)
		return (0);

	/*
	 * Read FilesInfo.
	 */
	if (*p != kFilesInfo)
		return (-1);

	if (parse_7zip_uint64(a, &(zip->numFiles)) < 0)
		return (-1);
	if (UMAX_ENTRY < zip->numFiles)
		return (-1);

	zip->entries = calloc((size_t)zip->numFiles, sizeof(*zip->entries));
	if (zip->entries == NULL)
		return (-1);
	entries = zip->entries;

	empty_streams = 0;
	for (;;) {
		int type;
		uint64_t size;
		size_t ll;

		if ((p = header_bytes(a, 1)) == NULL)
			return (-1);
		type = *p;
		if (type == kEnd)
			break;

		if (parse_7zip_uint64(a, &size) < 0)
			return (-1);
		if (zip->header_bytes_remaining < size)
			return (-1);
		ll = (size_t)size;

		switch (type) {
		case kEmptyStream:
			if (h->emptyStreamBools != NULL)
				return (-1);
			h->emptyStreamBools = calloc((size_t)zip->numFiles,
			    sizeof(*h->emptyStreamBools));
			if (h->emptyStreamBools == NULL)
				return (-1);
			if (read_Bools(
			    a, h->emptyStreamBools, (size_t)zip->numFiles) < 0)
				return (-1);
			empty_streams = 0;
			for (i = 0; i < zip->numFiles; i++) {
				if (h->emptyStreamBools[i])
					empty_streams++;
			}
			break;
		case kEmptyFile:
			if (empty_streams <= 0) {
				/* Unexcepted sequence. Skip this. */
				if (header_bytes(a, ll) == NULL)
					return (-1);
				break;
			}
			if (h->emptyFileBools != NULL)
				return (-1);
			h->emptyFileBools = calloc(empty_streams,
			    sizeof(*h->emptyFileBools));
			if (h->emptyFileBools == NULL)
				return (-1);
			if (read_Bools(a, h->emptyFileBools, empty_streams) < 0)
				return (-1);
			break;
		case kAnti:
			if (empty_streams <= 0) {
				/* Unexcepted sequence. Skip this. */
				if (header_bytes(a, ll) == NULL)
					return (-1);
				break;
			}
			if (h->antiBools != NULL)
				return (-1);
			h->antiBools = calloc(empty_streams,
			    sizeof(*h->antiBools));
			if (h->antiBools == NULL)
				return (-1);
			if (read_Bools(a, h->antiBools, empty_streams) < 0)
				return (-1);
			break;
		case kCTime:
		case kATime:
		case kMTime:
			if (read_Times(a, h, type) < 0)
				return (-1);
			break;
		case kName:
		{
			unsigned char *np;
			size_t nl, nb;

			/* Skip one byte. */
			if ((p = header_bytes(a, 1)) == NULL)
				return (-1);
			ll--;

			if ((ll & 1) || ll < zip->numFiles * 4)
				return (-1);

			if (zip->entry_names != NULL)
				return (-1);
			zip->entry_names = malloc(ll);
			if (zip->entry_names == NULL)
				return (-1);
			np = zip->entry_names;
			nb = ll;
			/*
			 * Copy whole file names.
			 * NOTE: This loop prevents from expanding
			 * the uncompressed buffer in order not to
			 * use extra memory resource.
			 */
			while (nb) {
				size_t b;
				if (nb > UBUFF_SIZE)
					b = UBUFF_SIZE;
				else
					b = nb;
				if ((p = header_bytes(a, b)) == NULL)
					return (-1);
				memcpy(np, p, b);
				np += b;
				nb -= b;
			}
			np = zip->entry_names;
			nl = ll;

			for (i = 0; i < zip->numFiles; i++) {
				entries[i].utf16name = np;
#if defined(_WIN32) && !defined(__CYGWIN__) && defined(_DEBUG)
				entries[i].wname = (wchar_t *)np;
#endif

				/* Find a terminator. */
				while (nl >= 2 && (np[0] || np[1])) {
					np += 2;
					nl -= 2;
				}
				if (nl < 2)
					return (-1);/* Terminator not found */
				entries[i].name_len = np - entries[i].utf16name;
				np += 2;
				nl -= 2;
			}
			break;
		}
		case kAttributes:
		{
			int allAreDefined;

			if ((p = header_bytes(a, 2)) == NULL)
				return (-1);
			allAreDefined = *p;
			if (h->attrBools != NULL)
				return (-1);
			h->attrBools = calloc((size_t)zip->numFiles,
			    sizeof(*h->attrBools));
			if (h->attrBools == NULL)
				return (-1);
			if (allAreDefined)
				memset(h->attrBools, 1, (size_t)zip->numFiles);
			else {
				if (read_Bools(a, h->attrBools,
				      (size_t)zip->numFiles) < 0)
					return (-1);
			}
			for (i = 0; i < zip->numFiles; i++) {
				if (h->attrBools[i]) {
					if ((p = header_bytes(a, 4)) == NULL)
						return (-1);
					entries[i].attr = archive_le32dec(p);
				}
			}
			break;
		}
		case kDummy:
			if (ll == 0)
				break;
			__LA_FALLTHROUGH;
		default:
			if (header_bytes(a, ll) == NULL)
				return (-1);
			break;
		}
	}

	/*
	 * Set up entry's attributes.
	 */
	folders = si->ci.folders;
	eindex = sindex = 0;
	folderIndex = indexInFolder = 0;
	for (i = 0; i < zip->numFiles; i++) {
		if (h->emptyStreamBools == NULL || h->emptyStreamBools[i] == 0)
			entries[i].flg |= HAS_STREAM;
		/* The high 16 bits of attributes is a posix file mode. */
		entries[i].mode = entries[i].attr >> 16;

		if (!(entries[i].attr & FILE_ATTRIBUTE_UNIX_EXTENSION)) {
			// Only windows permissions specified for this entry. Translate to
			// reasonable corresponding unix permissions.

			if (entries[i].attr & FILE_ATTRIBUTE_DIRECTORY) {
				if (entries[i].attr & FILE_ATTRIBUTE_READONLY) {
					// Read-only directory.
					entries[i].mode = AE_IFDIR | 0555;
				} else {
					// Read-write directory.
					entries[i].mode = AE_IFDIR | 0755;
				}
			} else if (entries[i].attr & FILE_ATTRIBUTE_READONLY) {
				// Readonly file.
				entries[i].mode = AE_IFREG | 0444;
			} else {
				// Assume read-write file.
				entries[i].mode = AE_IFREG | 0644;
			}
		}

		if (entries[i].flg & HAS_STREAM) {
			if ((size_t)sindex >= si->ss.unpack_streams)
				return (-1);
			if (entries[i].mode == 0)
				entries[i].mode = AE_IFREG | 0666;
			if (si->ss.digestsDefined[sindex])
				entries[i].flg |= CRC32_IS_SET;
			entries[i].ssIndex = sindex;
			sindex++;
		} else {
			int dir;
			if (h->emptyFileBools == NULL)
				dir = 1;
			else {
				if (h->emptyFileBools[eindex])
					dir = 0;
				else
					dir = 1;
				eindex++;
			}
			if (entries[i].mode == 0) {
				if (dir)
					entries[i].mode = AE_IFDIR | 0777;
				else
					entries[i].mode = AE_IFREG | 0666;
			} else if (dir &&
			    (entries[i].mode & AE_IFMT) != AE_IFDIR) {
				entries[i].mode &= ~AE_IFMT;
				entries[i].mode |= AE_IFDIR;
			}
			if ((entries[i].mode & AE_IFMT) == AE_IFDIR &&
			    entries[i].name_len >= 2 &&
			    (entries[i].utf16name[entries[i].name_len-2] != '/' ||
			     entries[i].utf16name[entries[i].name_len-1] != 0)) {
				entries[i].utf16name[entries[i].name_len] = '/';
				entries[i].utf16name[entries[i].name_len+1] = 0;
				entries[i].name_len += 2;
			}
			entries[i].ssIndex = -1;
		}
		if (entries[i].attr & FILE_ATTRIBUTE_READONLY)
			entries[i].mode &= ~0222;/* Read only. */

		if ((entries[i].flg & HAS_STREAM) == 0 && indexInFolder == 0) {
			/*
			 * The entry is an empty file or a directory file,
			 * those both have no contents.
			 */
			entries[i].folderIndex = -1;
			continue;
		}
		if (indexInFolder == 0) {
			for (;;) {
				if (folderIndex >= si->ci.numFolders)
					return (-1);
				if (folders[folderIndex].numUnpackStreams)
					break;
				folderIndex++;
			}
		}
		entries[i].folderIndex = folderIndex;
		if ((entries[i].flg & HAS_STREAM) == 0)
			continue;
		indexInFolder++;
		if (indexInFolder >= folders[folderIndex].numUnpackStreams) {
			folderIndex++;
			indexInFolder = 0;
		}
	}

	return (0);
}